

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

int ToUpperCase(uint8_t *p)

{
  uint8_t *p_local;
  int local_4;
  
  if (*p < 0xc0) {
    if ((0x60 < *p) && (*p < 0x7b)) {
      *p = *p ^ 0x20;
    }
    local_4 = 1;
  }
  else if (*p < 0xe0) {
    p[1] = p[1] ^ 0x20;
    local_4 = 2;
  }
  else {
    p[2] = p[2] ^ 5;
    local_4 = 3;
  }
  return local_4;
}

Assistant:

static int ToUpperCase(uint8_t* p) {
  if (p[0] < 0xC0) {
    if (p[0] >= 'a' && p[0] <= 'z') {
      p[0] ^= 32;
    }
    return 1;
  }
  /* An overly simplified uppercasing model for UTF-8. */
  if (p[0] < 0xE0) {
    p[1] ^= 32;
    return 2;
  }
  /* An arbitrary transform for three byte characters. */
  p[2] ^= 5;
  return 3;
}